

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O1

void compute_sgrproj_err(uint8_t *dat8,int width,int height,int dat_stride,uint8_t *src8,
                        int src_stride,int use_highbitdepth,int bit_depth,int pu_width,int pu_height
                        ,int ep,int32_t *flt0,int32_t *flt1,int flt_stride,int *exqd,int64_t *err,
                        aom_internal_error_info *error_info)

{
  int iVar1;
  _func_void_uint8_t_ptr_int_int_int_uint8_t_ptr_int_int32_t_ptr_int_int32_t_ptr_int_int64_t_2__ptr_int64_t_ptr_sgr_params_type_ptr
  **pp_Var2;
  int64_t iVar3;
  int64_t iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int32_t *piVar9;
  int iVar10;
  long lVar11;
  sgr_params_type *params;
  int32_t *piVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  bool bVar16;
  uint8_t *local_d8;
  int64_t local_b8;
  long lStack_b0;
  long local_a0;
  int32_t *local_98;
  int32_t *local_90;
  int64_t H [2] [2];
  
  if (0 < height) {
    lVar6 = (long)pu_width;
    lVar8 = (long)pu_height;
    local_90 = flt0;
    local_98 = flt1;
    lVar7 = 0;
    local_d8 = dat8;
    local_a0 = lVar6;
    do {
      iVar13 = height - (int)lVar7;
      if (pu_height <= iVar13) {
        iVar13 = pu_height;
      }
      if (0 < width) {
        lVar15 = 0;
        piVar9 = local_90;
        piVar12 = local_98;
        iVar10 = width;
        do {
          iVar1 = iVar10;
          if (pu_width <= iVar10) {
            iVar1 = pu_width;
          }
          iVar1 = (*av1_selfguided_restoration)
                            (local_d8 + lVar15,iVar1,iVar13,dat_stride,piVar9,piVar12,flt_stride,ep,
                             bit_depth,use_highbitdepth);
          if (iVar1 != 0) {
            aom_internal_error(error_info,AOM_CODEC_MEM_ERROR,
                               "Error allocating buffer in av1_selfguided_restoration");
          }
          lVar15 = lVar15 + local_a0;
          piVar12 = piVar12 + lVar6;
          piVar9 = piVar9 + lVar6;
          iVar10 = iVar10 - pu_width;
        } while (lVar15 < width);
      }
      lVar7 = lVar7 + lVar8;
      local_98 = local_98 + flt_stride * lVar8;
      local_90 = local_90 + flt_stride * lVar8;
      local_d8 = local_d8 + dat_stride * lVar8;
    } while (lVar7 < (long)(ulong)(uint)height);
  }
  lVar6 = (long)ep;
  params = av1_sgr_params + lVar6;
  H[1][0] = 0;
  H[1][1] = 0;
  H[0][0] = 0;
  H[0][1] = 0;
  local_b8 = 0;
  lStack_b0 = 0;
  if (use_highbitdepth == 0) {
    if ((width & 7U) == 0) {
      pp_Var2 = &av1_calc_proj_params;
      goto LAB_0020547a;
    }
    av1_calc_proj_params_c
              (src8,width,height,src_stride,dat8,dat_stride,flt0,flt_stride,flt1,flt_stride,H,
               &local_b8,params);
  }
  else if ((width & 7U) == 0) {
    pp_Var2 = &av1_calc_proj_params_high_bd;
LAB_0020547a:
    (**pp_Var2)(src8,width,height,src_stride,dat8,dat_stride,flt0,flt_stride,flt1,flt_stride,H,
                &local_b8,params);
  }
  else {
    av1_calc_proj_params_high_bd_c
              (src8,width,height,src_stride,dat8,dat_stride,flt0,flt_stride,flt1,flt_stride,H,
               &local_b8,params);
  }
  iVar13 = params->r[0];
  if (iVar13 == 0) {
    iVar10 = 0;
    if (H[1][1] == 0) {
      iVar1 = 0;
      iVar10 = 0;
    }
    else {
      iVar1 = (int)((H[1][1] / (long)((ulong)(-1 < lStack_b0) * 4 + -2) + lStack_b0 * 0x80) /
                   H[1][1]);
    }
  }
  else if (av1_sgr_params[lVar6].r[1] == 0) {
    iVar1 = 0;
    if (H[0][0] == 0) {
      iVar10 = 0;
    }
    else {
      iVar10 = (int)((H[0][0] / (long)((ulong)(-1 < local_b8) * 4 + -2) + local_b8 * 0x80) / H[0][0]
                    );
      iVar1 = 0;
    }
  }
  else {
    lVar7 = H[1][1] * H[0][0] - H[1][0] * H[0][1];
    iVar10 = 0;
    iVar1 = 0;
    if (lVar7 != 0) {
      lVar8 = H[1][1] * local_b8 - H[0][1] * lStack_b0;
      if ((uint)((ulong)(lVar8 + -0x100000000000000) >> 0x39) < 0x7f) {
        lVar11 = lVar7 + 0x7f;
        if (-1 < lVar7) {
          lVar11 = lVar7;
        }
        lVar15 = (ulong)(-1 < lVar8) * 0x200 + -0x100;
        lVar11 = lVar11 >> 7;
      }
      else {
        bVar16 = -1 < lVar8;
        lVar8 = lVar8 * 0x80;
        lVar15 = (ulong)bVar16 * 4 + -2;
        lVar11 = lVar7;
      }
      iVar10 = (int)((lVar7 / lVar15 + lVar8) / lVar11);
      lVar8 = lStack_b0 * H[0][0] - local_b8 * H[1][0];
      if (lVar8 + 0xff00000000000000U < 0xfe00000000000000) {
        lVar11 = lVar7 + 0x7f;
        if (-1 < lVar7) {
          lVar11 = lVar7;
        }
        lVar15 = (ulong)(-1 < lVar8) * 0x200 + -0x100;
        lVar11 = lVar11 >> 7;
      }
      else {
        bVar16 = -1 < lVar8;
        lVar8 = lVar8 * 0x80;
        lVar15 = (ulong)bVar16 * 4 + -2;
        lVar11 = lVar7;
      }
      iVar1 = (int)((lVar7 / lVar15 + lVar8) / lVar11);
    }
  }
  if (iVar13 == 0) {
    *exqd = 0;
  }
  else {
    iVar5 = 0x1f;
    if (iVar10 < 0x1f) {
      iVar5 = iVar10;
    }
    iVar10 = -0x60;
    if (-0x60 < iVar5) {
      iVar10 = iVar5;
    }
    iVar5 = av1_sgr_params[lVar6].r[1];
    *exqd = iVar10;
    if (iVar5 == 0) {
      iVar10 = 0x5f;
      goto LAB_002056f1;
    }
    iVar1 = iVar1 + iVar10;
  }
  iVar5 = 0x5f;
  if (0x80 - iVar1 < 0x5f) {
    iVar5 = 0x80 - iVar1;
  }
  iVar10 = -0x20;
  if (-0x20 < iVar5) {
    iVar10 = iVar5;
  }
LAB_002056f1:
  exqd[1] = iVar10;
  iVar3 = get_pixel_proj_error
                    (src8,width,height,src_stride,dat8,dat_stride,use_highbitdepth,flt0,flt_stride,
                     flt1,flt_stride,exqd,params);
  local_a0 = CONCAT44(local_a0._4_4_,iVar13);
  uVar14 = 2;
  do {
    lVar7 = 0;
    do {
      if ((iVar13 != 0 || (int)lVar7 != 0) && ((lVar7 != 1 || (av1_sgr_params[lVar6].r[1] != 0)))) {
        iVar13 = (&DAT_00506300)[lVar7];
        bVar16 = false;
        iVar4 = iVar3;
        do {
          iVar3 = iVar4;
          if ((int)(exqd[lVar7] - uVar14) < iVar13) break;
          exqd[lVar7] = exqd[lVar7] - uVar14;
          iVar3 = get_pixel_proj_error
                            (src8,width,height,src_stride,dat8,dat_stride,use_highbitdepth,flt0,
                             flt_stride,flt1,flt_stride,exqd,params);
          if (iVar4 < iVar3) {
            exqd[lVar7] = exqd[lVar7] + uVar14;
            iVar3 = iVar4;
            break;
          }
          bVar16 = true;
          iVar4 = iVar3;
        } while (uVar14 == 2);
        if (!bVar16) {
          iVar13 = (&DAT_00506308)[lVar7];
          do {
            if (iVar13 < (int)(exqd[lVar7] + uVar14)) break;
            exqd[lVar7] = exqd[lVar7] + uVar14;
            iVar4 = get_pixel_proj_error
                              (src8,width,height,src_stride,dat8,dat_stride,use_highbitdepth,flt0,
                               flt_stride,flt1,flt_stride,exqd,params);
            if (iVar3 < iVar4) {
              exqd[lVar7] = exqd[lVar7] - uVar14;
              break;
            }
            iVar3 = iVar4;
          } while (uVar14 == 2);
        }
        iVar13 = (int)local_a0;
        if (bVar16) break;
      }
      bVar16 = lVar7 == 0;
      lVar7 = lVar7 + 1;
    } while (bVar16);
    bVar16 = uVar14 < 2;
    uVar14 = uVar14 >> 1;
    if (bVar16) {
      *err = iVar3;
      return;
    }
  } while( true );
}

Assistant:

static inline void compute_sgrproj_err(
    const uint8_t *dat8, const int width, const int height,
    const int dat_stride, const uint8_t *src8, const int src_stride,
    const int use_highbitdepth, const int bit_depth, const int pu_width,
    const int pu_height, const int ep, int32_t *flt0, int32_t *flt1,
    const int flt_stride, int *exqd, int64_t *err,
    struct aom_internal_error_info *error_info) {
  int exq[2];
  apply_sgr(ep, dat8, width, height, dat_stride, use_highbitdepth, bit_depth,
            pu_width, pu_height, flt0, flt1, flt_stride, error_info);
  const sgr_params_type *const params = &av1_sgr_params[ep];
  get_proj_subspace(src8, width, height, src_stride, dat8, dat_stride,
                    use_highbitdepth, flt0, flt_stride, flt1, flt_stride, exq,
                    params);
  encode_xq(exq, exqd, params);
  *err = finer_search_pixel_proj_error(
      src8, width, height, src_stride, dat8, dat_stride, use_highbitdepth, flt0,
      flt_stride, flt1, flt_stride, 2, exqd, params);
}